

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_newref(ASMState *as,IRIns *ir)

{
  Reg dest;
  IRRef local_2c;
  uint local_28;
  IRRef args [3];
  CCallInfo *ci;
  IRIns *ir_local;
  ASMState *as_local;
  
  args[1] = 0x1d7830;
  args[2] = 0;
  if ((ir->field_1).r != 0xfe) {
    asm_snap_prep(as);
    local_2c = 0x7fff;
    local_28 = (uint)(ir->field_0).op1;
    args[0] = 0x7ffd;
    asm_setupresult(as,ir,(CCallInfo *)args._4_8_);
    asm_gencall(as,(CCallInfo *)args._4_8_,&local_2c);
    dest = ra_releasetmp(as,0x7ffd);
    asm_tvptr(as,dest,(uint)(ir->field_0).op2,1);
  }
  return;
}

Assistant:

static void asm_newref(ASMState *as, IRIns *ir)
{
  const CCallInfo *ci = &lj_ir_callinfo[IRCALL_lj_tab_newkey];
  IRRef args[3];
  if (ir->r == RID_SINK)
    return;
  asm_snap_prep(as);
  args[0] = ASMREF_L;     /* lua_State *L */
  args[1] = ir->op1;      /* GCtab *t     */
  args[2] = ASMREF_TMP1;  /* cTValue *key */
  asm_setupresult(as, ir, ci);  /* TValue * */
  asm_gencall(as, ci, args);
  asm_tvptr(as, ra_releasetmp(as, ASMREF_TMP1), ir->op2, IRTMPREF_IN1);
}